

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::SerialArena::SerialArena(SerialArena *this,ThreadSafeArena *parent)

{
  ArenaBlock *__p;
  ThreadSafeArena *parent_local;
  SerialArena *this_local;
  
  std::atomic<char_*>::atomic(&this->ptr_,(__pointer_type)0x0);
  this->limit_ = (char *)0x0;
  this->prefetch_ptr_ = (char *)0x0;
  cleanup::ChunkList::ChunkList(&this->cleanup_list_);
  std::atomic<google::protobuf::internal::StringBlock_*>::atomic
            (&this->string_block_,(__pointer_type)0x0);
  std::atomic<unsigned_long>::atomic(&this->string_block_unused_,0);
  __p = anon_unknown_12::SentryArenaBlock();
  std::atomic<google::protobuf::internal::ArenaBlock_*>::atomic(&this->head_,__p);
  std::atomic<unsigned_long>::atomic(&this->space_used_,0);
  std::atomic<unsigned_long>::atomic(&this->space_allocated_,0);
  this->parent_ = parent;
  this->cached_block_length_ = '\0';
  this->cached_blocks_ = (CachedBlock **)0x0;
  return;
}

Assistant:

SerialArena::SerialArena(ThreadSafeArena& parent)
    : head_{SentryArenaBlock()}, parent_{parent} {}